

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

optional<pbrt::Token> * __thiscall
pstd::optional<pbrt::Token>::operator=(optional<pbrt::Token> *this,Token *v)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  reset(this);
  *(undefined8 *)((long)&this->optionalValue + 0x20) = *(undefined8 *)&(v->loc).line;
  pcVar1 = (v->token)._M_str;
  sVar2 = (v->loc).filename._M_len;
  pcVar3 = (v->loc).filename._M_str;
  (this->optionalValue).__align = (anon_struct_8_0_00000001_for___align)(v->token)._M_len;
  *(char **)((long)&this->optionalValue + 8) = pcVar1;
  *(size_t *)((long)&this->optionalValue + 0x10) = sVar2;
  *(char **)((long)&this->optionalValue + 0x18) = pcVar3;
  this->set = true;
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(const T &v) {
        reset();
        new (ptr()) T(v);
        set = true;
        return *this;
    }